

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ditImageCompareTests.cpp
# Opt level: O1

void __thiscall dit::BilinearCompareCase::~BilinearCompareCase(BilinearCompareCase *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  (this->super_TestCase).super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__BilinearCompareCase_00273c80;
  pcVar2 = (this->m_cmpImg)._M_dataplus._M_p;
  paVar1 = &(this->m_cmpImg).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->m_refImg)._M_dataplus._M_p;
  paVar1 = &(this->m_refImg).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  tcu::TestCase::~TestCase(&this->super_TestCase);
  operator_delete(this,0xb8);
  return;
}

Assistant:

BilinearCompareCase (tcu::TestContext& testCtx, const char* name, const char* refImg, const char* cmpImg, const tcu::RGBA& threshold, bool expectedResult)
		: tcu::TestCase		(testCtx, name, "")
		, m_refImg			(refImg)
		, m_cmpImg			(cmpImg)
		, m_threshold		(threshold)
		, m_expectedResult	(expectedResult)
	{
	}